

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

CountExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::
ReadCountExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
              *this)

{
  int iVar1;
  
  iVar1 = ReadNumArgs(this,1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  if (0 < iVar1) {
    do {
      ReadLogicalExpr(this);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }